

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall discordpp::Sticker::Sticker(Sticker *this,Sticker *param_1)

{
  field<discordpp::Snowflake>::field(&this->id,&param_1->id);
  omittable_field<discordpp::Snowflake>::omittable_field(&this->pack_id,&param_1->pack_id);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->name,&param_1->name);
  nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  nullable_field(&this->description,&param_1->description);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->tags,&param_1->tags);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->asset,&param_1->asset);
  field<int>::field(&this->type,&param_1->type);
  field<int>::field(&this->format_type,&param_1->format_type);
  omittable_field<bool>::omittable_field(&this->available,&param_1->available);
  omittable_field<discordpp::Snowflake>::omittable_field(&this->guild_id,&param_1->guild_id);
  omittable_field<discordpp::User>::omittable_field(&this->user,&param_1->user);
  omittable_field<int>::omittable_field(&this->sort_value,&param_1->sort_value);
  return;
}

Assistant:

Sticker(
        field<Snowflake> id = uninitialized,
        omittable_field<Snowflake> pack_id = omitted,
        field<std::string> name = uninitialized,
        nullable_field<std::string> description = uninitialized,
        field<std::string> tags = uninitialized,
        omittable_field<std::string> asset = omitted,
        field<int> type = uninitialized,
        field<int> format_type = uninitialized,
        omittable_field<bool> available = omitted,
        omittable_field<Snowflake> guild_id = omitted,
        omittable_field<User> user = omitted,
        omittable_field<int> sort_value = omitted
    ):
        id(id),
        pack_id(pack_id),
        name(name),
        description(description),
        tags(tags),
        asset(asset),
        type(type),
        format_type(format_type),
        available(available),
        guild_id(guild_id),
        user(user),
        sort_value(sort_value)
    {}